

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser_p.h
# Opt level: O2

void __thiscall QCss::ValueExtractor::~ValueExtractor(ValueExtractor *this)

{
  QPalette::~QPalette(&this->pal);
  QFont::~QFont(&this->f);
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::Declaration> *)this);
  return;
}

Assistant:

struct Q_GUI_EXPORT ValueExtractor
{
    ValueExtractor(const QList<Declaration> &declarations, const QPalette & = QPalette());

    bool extractFont(QFont *font, int *fontSizeAdjustment);
    bool extractBackground(QBrush *, QString *, Repeat *, Qt::Alignment *, QCss::Origin *, QCss::Attachment *,
                           QCss::Origin *);
    bool extractGeometry(int *w, int *h, int *minw, int *minh, int *maxw, int *maxh);
    bool extractPosition(int *l, int *t, int *r, int *b, QCss::Origin *, Qt::Alignment *,
                         QCss::PositionMode *, Qt::Alignment *);
    bool extractBox(int *margins, int *paddings, int *spacing = nullptr);
    bool extractBorder(int *borders, QBrush *colors, BorderStyle *Styles, QSize *radii);
    bool extractOutline(int *borders, QBrush *colors, BorderStyle *Styles, QSize *radii, int *offsets);
    bool extractPalette(QBrush *foreground, QBrush *selectedForeground, QBrush *selectedBackground,
                        QBrush *alternateBackground, QBrush *placeHolderTextForeground,
                        QBrush *accent);
    int  extractStyleFeatures();
    bool extractImage(QIcon *icon, Qt::Alignment *a, QSize *size);
    bool extractIcon(QIcon *icon, QSize *size);

    void lengthValues(const Declaration &decl, int *m);
    QTextLength textLength(const Declaration &decl);

private:
    void extractFont();
    void borderValue(const Declaration &decl, int *width, QCss::BorderStyle *style, QBrush *color);
    LengthData lengthValue(const Value& v);
    int lengthValue(const Declaration &decl);
    QSize sizeValue(const Declaration &decl);
    void sizeValues(const Declaration &decl, QSize *radii);

    QList<Declaration> declarations;
    QFont f;
    int adjustment;
    int fontExtracted;
    QPalette pal;
}